

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O2

void __thiscall
Assimp::COBImporter::ReadBasicNodeInfo_Binary
          (COBImporter *this,Node *msh,StreamReaderLE *reader,ChunkInfo *param_3)

{
  string *out;
  float *pfVar1;
  StreamReaderLE *this_00;
  uint x;
  long lVar2;
  uint y;
  uint p_iIndex;
  float fVar3;
  string local_1c0 [32];
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> local_1a0 [376];
  
  this_00 = reader;
  StreamReader<false,_false>::Get<short>(reader);
  out = &msh->name;
  ReadString_Binary((COBImporter *)this_00,out,reader);
  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
  basic_formatter<std::__cxx11::string>(local_1a0,out);
  std::operator<<((ostream *)local_1a0,'_');
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)out,local_1c0);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  StreamReader<false,_false>::IncPtr(reader,0x30);
  (msh->transform).a1 = 1.0;
  (msh->transform).a2 = 0.0;
  (msh->transform).a3 = 0.0;
  (msh->transform).a4 = 0.0;
  (msh->transform).b1 = 0.0;
  (msh->transform).b2 = 1.0;
  (msh->transform).b3 = 0.0;
  (msh->transform).b4 = 0.0;
  (msh->transform).c1 = 0.0;
  (msh->transform).c2 = 0.0;
  (msh->transform).c3 = 1.0;
  (msh->transform).c4 = 0.0;
  (msh->transform).d1 = 0.0;
  (msh->transform).d2 = 0.0;
  (msh->transform).d3 = 0.0;
  (msh->transform).d4 = 1.0;
  for (p_iIndex = 0; p_iIndex != 3; p_iIndex = p_iIndex + 1) {
    for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
      fVar3 = StreamReader<false,_false>::Get<float>(reader);
      pfVar1 = aiMatrix4x4t<float>::operator[](&msh->transform,p_iIndex);
      pfVar1[lVar2] = fVar3;
    }
  }
  return;
}

Assistant:

void COBImporter::ReadBasicNodeInfo_Binary(Node& msh, StreamReaderLE& reader, const ChunkInfo& /*nfo*/)
{
    const unsigned int dupes = reader.GetI2();
    ReadString_Binary(msh.name,reader);

    msh.name = format(msh.name)<<'_'<<dupes;

    // skip local axes for the moment
    reader.IncPtr(48);

    msh.transform = aiMatrix4x4();
    for(unsigned int y = 0; y < 3; ++y) {
        for(unsigned int x =0; x < 4; ++x) {
            msh.transform[y][x] = reader.GetF4();
        }
    }
}